

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall
Js::DynamicProfileInfo::ResetPolymorphicCallSiteInfo
          (DynamicProfileInfo *this,ProfileId callSiteId,LocalFunctionId functionId)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = CCLock::IsLocked((CCLock *)callSiteInfoCS);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x35b,"(this->callSiteInfoCS.IsLocked())",
                                "this->callSiteInfoCS.IsLocked()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  puVar1 = &(this->callSiteInfo).ptr[callSiteId].field_0x2;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0x7fff;
  (this->callSiteInfo).ptr[callSiteId].u.functionData.sourceId = 0xfffffffd;
  (this->callSiteInfo).ptr[callSiteId].u.functionData.functionId = functionId;
  this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
  return;
}

Assistant:

void DynamicProfileInfo::ResetPolymorphicCallSiteInfo(ProfileId callSiteId, Js::LocalFunctionId functionId)
    {
        Assert(this->callSiteInfoCS.IsLocked());

        callSiteInfo[callSiteId].isPolymorphic = false;
        callSiteInfo[callSiteId].u.functionData.sourceId = CurrentSourceId;
        callSiteInfo[callSiteId].u.functionData.functionId = functionId;
        this->currentInlinerVersion++;
    }